

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

int gdImageColorResolveAlpha(gdImagePtr im,int r,int g,int b,int a)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  if (im->trueColor != 0) {
    return b + a * 0x1000000 + g * 0x100 + r * 0x10000;
  }
  uVar1 = im->colorsTotal;
  uVar8 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  lVar5 = 0x3f804;
  uVar7 = 0xffffffff;
  uVar2 = 0xffffffff;
  do {
    if (uVar3 == uVar8) {
      uVar6 = (uint)uVar7;
      if ((uint)uVar7 == 0xffffffff) {
        if (uVar1 == 0x100) {
          return (int)uVar2;
        }
        im->colorsTotal = uVar1 + 1;
        uVar6 = uVar1;
      }
      im->red[(int)uVar6] = r;
      im->green[(int)uVar6] = g;
      im->blue[(int)uVar6] = b;
      im->alpha[(int)uVar6] = a;
      im->open[(int)uVar6] = 0;
      return uVar6;
    }
    if (im->open[uVar8] == 0) {
      if ((uVar8 != (uint)im->transparent) &&
         (lVar10 = (long)im->red[uVar8] - (long)r, lVar11 = (long)im->green[uVar8] - (long)g,
         lVar9 = (long)im->blue[uVar8] - (long)b, lVar4 = (long)im->alpha[uVar8] - (long)a,
         lVar4 = lVar4 * lVar4 + lVar9 * lVar9 + lVar11 * lVar11 + lVar10 * lVar10, lVar4 < lVar5))
      {
        if (lVar4 == 0) {
          return (int)uVar8;
        }
        uVar2 = uVar8 & 0xffffffff;
        lVar5 = lVar4;
      }
    }
    else {
      uVar7 = uVar8 & 0xffffffff;
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

BGD_DECLARE(int) gdImageColorResolveAlpha (gdImagePtr im, int r, int g, int b, int a)
{
	int c;
	int ct = -1;
	int op = -1;
	long rd, gd, bd, ad, dist;
	long mindist = 4 * 255 * 255;	/* init to max poss dist */
	if (im->trueColor) {
		return gdTrueColorAlpha (r, g, b, a);
	}

	for (c = 0; c < im->colorsTotal; c++) {
		if (im->open[c]) {
			op = c;		/* Save open slot */
			continue;		/* Color not in use */
		}
		if (c == im->transparent) {
			/* don't ever resolve to the color that has
			 * been designated as the transparent color */
			continue;
		}
		rd = (long) (im->red[c] - r);
		gd = (long) (im->green[c] - g);
		bd = (long) (im->blue[c] - b);
		ad = (long) (im->alpha[c] - a);
		dist = rd * rd + gd * gd + bd * bd + ad * ad;
		if (dist < mindist) {
			if (dist == 0) {
				return c;		/* Return exact match color */
			}
			mindist = dist;
			ct = c;
		}
	}
	/* no exact match.  We now know closest, but first try to allocate exact */
	if (op == -1) {
		op = im->colorsTotal;
		if (op == gdMaxColors) {
			/* No room for more colors */
			return ct;		/* Return closest available color */
		}
		im->colorsTotal++;
	}
	im->red[op] = r;
	im->green[op] = g;
	im->blue[op] = b;
	im->alpha[op] = a;
	im->open[op] = 0;
	return op;			/* Return newly allocated color */
}